

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  void *pvVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  void *pvVar18;
  int iVar19;
  void *pvVar20;
  byte *pbVar21;
  int iVar22;
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Mat m;
  Mat local_78;
  
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    else if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar14 = 1;
      iVar25 = h;
      if (stride - w == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (iVar25 < 1) {
        return __return_storage_ptr__;
      }
      iVar19 = 0;
      pbVar21 = pixels;
      do {
        uVar13 = iVar14 * w + 1;
        if (0 < iVar14 * w) {
          do {
            *pfVar8 = (float)*pbVar21;
            pbVar21 = pbVar21 + 1;
            pfVar8 = pfVar8 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
        pbVar21 = pbVar21 + (stride - w);
        iVar19 = iVar19 + 1;
      } while (iVar19 != iVar25);
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar25 = stride + w * -4;
    iVar19 = 1;
    iVar14 = h;
    if (iVar25 == 0) {
      iVar14 = 1;
      iVar19 = h;
    }
    if (iVar14 < 1) {
      return __return_storage_ptr__;
    }
    lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar16 = (float *)(lVar9 * 3 + (long)pfVar8);
    pfVar17 = (float *)((long)pfVar8 + lVar9 * 2);
    pfVar10 = (float *)(lVar9 + (long)pfVar8);
    iVar22 = 0;
    do {
      uVar13 = iVar19 * w + 1;
      if (0 < iVar19 * w) {
        do {
          *pfVar8 = (float)*pixels;
          *pfVar10 = (float)pixels[1];
          *pfVar17 = (float)pixels[2];
          *pfVar16 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar8 = pfVar8 + 1;
          pfVar10 = pfVar10 + 1;
          pfVar17 = pfVar17 + 1;
          pfVar16 = pfVar16 + 1;
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
      }
      pixels = pixels + iVar25;
      iVar22 = iVar22 + 1;
    } while (iVar22 != iVar14);
    return __return_storage_ptr__;
  }
  if (type < 0x30001) {
    switch(type) {
    case 0x10002:
switchD_00132e24_caseD_20001:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10003:
switchD_00132e24_caseD_20003:
      from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10004:
switchD_00132e24_caseD_20005:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar19 = stride + w * -4;
      iVar14 = 1;
      iVar25 = h;
      if (iVar19 == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (iVar25 < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar17 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar22 = 0;
      do {
        uVar13 = iVar14 * w + 1;
        if (0 < iVar14 * w) {
          do {
            *pfVar8 = (float)*pixels;
            *pfVar10 = (float)pixels[1];
            *pfVar17 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar17 = pfVar17 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
        pixels = pixels + iVar19;
        iVar22 = iVar22 + 1;
      } while (iVar22 != iVar25);
      return __return_storage_ptr__;
    case 0x10005:
switchD_00132e24_caseD_20004:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar19 = stride + w * -4;
      iVar14 = 1;
      iVar25 = h;
      if (iVar19 == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (iVar25 < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar17 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar22 = 0;
      do {
        uVar13 = iVar14 * w + 1;
        if (0 < iVar14 * w) {
          do {
            *pfVar8 = (float)pixels[2];
            *pfVar10 = (float)pixels[1];
            *pfVar17 = (float)*pixels;
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar17 = pfVar17 + 1;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
        pixels = pixels + iVar19;
        iVar22 = iVar22 + 1;
      } while (iVar22 != iVar25);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x20001:
        goto switchD_00132e24_caseD_20001;
      default:
        goto switchD_00132c3d_default;
      case 0x20003:
        goto switchD_00132e24_caseD_20003;
      case 0x20004:
        goto switchD_00132e24_caseD_20004;
      case 0x20005:
        goto switchD_00132e24_caseD_20005;
      }
    }
  }
  switch(type) {
  case 0x30001:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if ((pfVar8 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar19 = stride + w * -3;
      iVar14 = 1;
      iVar25 = h;
      if (iVar19 == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (0 < iVar25) {
        iVar22 = 0;
        do {
          uVar13 = iVar14 * w + 1;
          if (0 < iVar14 * w) {
            do {
              bVar1 = pixels[2];
              *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
              pixels = pixels + 3;
              pfVar8 = pfVar8 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar19;
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar25);
      }
    }
    break;
  case 0x30002:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if ((pfVar8 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar19 = stride + w * -3;
      iVar14 = 1;
      iVar25 = h;
      if (iVar19 == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (0 < iVar25) {
        iVar22 = 0;
        do {
          uVar13 = iVar14 * w + 1;
          if (0 < iVar14 * w) {
            do {
              bVar1 = *pixels;
              *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
              pixels = pixels + 3;
              pfVar8 = pfVar8 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar19;
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar25);
      }
    }
    break;
  case 0x30003:
switchD_00132c3d_default:
    from_pixels((Mat *)(ulong)(uint)type);
    return __return_storage_ptr__;
  case 0x30004:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if ((pfVar8 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar19 = stride + w * -4;
      iVar14 = 1;
      iVar25 = h;
      if (iVar19 == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (0 < iVar25) {
        iVar22 = 0;
        do {
          uVar13 = iVar14 * w + 1;
          if (0 < iVar14 * w) {
            do {
              bVar1 = pixels[2];
              *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
              pixels = pixels + 4;
              pfVar8 = pfVar8 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar19;
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar25);
      }
    }
    break;
  case 0x30005:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if ((pfVar8 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar19 = stride + w * -4;
      iVar14 = 1;
      iVar25 = h;
      if (iVar19 == 0) {
        iVar25 = 1;
        iVar14 = h;
      }
      if (0 < iVar25) {
        iVar22 = 0;
        do {
          uVar13 = iVar14 * w + 1;
          if (0 < iVar14 * w) {
            do {
              bVar1 = *pixels;
              *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
              pixels = pixels + 4;
              pfVar8 = pfVar8 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          pixels = pixels + iVar19;
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar25);
      }
    }
    break;
  default:
    switch(type) {
    case 0x40001:
switchD_00132c3d_caseD_50002:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.w = __return_storage_ptr__->w;
      local_78.h = __return_storage_ptr__->h;
      local_78.d = __return_storage_ptr__->d;
      local_78.elemsize = __return_storage_ptr__->elemsize;
      local_78.elempack = __return_storage_ptr__->elempack;
      local_78.allocator = __return_storage_ptr__->allocator;
      local_78.refcount = (int *)0x0;
      local_78.c = 3;
      local_78.cstep =
           ((long)local_78.d * local_78.elemsize * (long)local_78.h * (long)local_78.w + 0xf &
           0xfffffffffffffff0) / local_78.elemsize;
      local_78.dims = __return_storage_ptr__->dims;
      from_rgb(pixels,w,h,stride,&local_78,allocator);
      auVar5 = _DAT_005a4940;
      auVar4 = _DAT_005a4930;
      auVar3 = _DAT_005a4070;
      lVar9 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar2 = __return_storage_ptr__->elemsize;
      uVar6 = uVar2 * lVar9 + 0xf & 0xfffffffffffffff0;
      uVar12 = uVar6 % uVar2;
      iVar25 = (int)(uVar6 / uVar2);
      if (__return_storage_ptr__->dims == 4) {
        iVar25 = (int)lVar9;
      }
      uVar13 = iVar25 * __return_storage_ptr__->d;
      if (0 < (int)uVar13) {
        pvVar7 = __return_storage_ptr__->data;
        lVar9 = uVar2 * __return_storage_ptr__->cstep;
        lVar15 = (ulong)uVar13 - 1;
        auVar23._8_4_ = (int)lVar15;
        auVar23._0_8_ = lVar15;
        auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar12 = 0;
        auVar23 = auVar23 ^ _DAT_005a4070;
        do {
          auVar26._8_4_ = (int)uVar12;
          auVar26._0_8_ = uVar12;
          auVar26._12_4_ = (int)(uVar12 >> 0x20);
          auVar24 = (auVar26 | auVar5) ^ auVar3;
          iVar25 = auVar23._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar25 && auVar23._0_4_ < auVar24._0_4_ ||
                      iVar25 < auVar24._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3) = 0x437f0000;
          }
          if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
              auVar24._12_4_ <= auVar23._12_4_) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 4) = 0x437f0000;
          }
          auVar24 = (auVar26 | auVar4) ^ auVar3;
          iVar14 = auVar24._4_4_;
          if (iVar14 <= iVar25 && (iVar14 != iVar25 || auVar24._0_4_ <= auVar23._0_4_)) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar13 + 3 & 0xfffffffc) != uVar12);
      }
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar12);
        return __return_storage_ptr__;
      }
      break;
    case 0x40002:
switchD_00132c3d_caseD_50001:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.w = __return_storage_ptr__->w;
      local_78.h = __return_storage_ptr__->h;
      local_78.d = __return_storage_ptr__->d;
      local_78.elemsize = __return_storage_ptr__->elemsize;
      local_78.elempack = __return_storage_ptr__->elempack;
      local_78.allocator = __return_storage_ptr__->allocator;
      local_78.refcount = (int *)0x0;
      local_78.c = 3;
      local_78.cstep =
           ((long)local_78.d * local_78.elemsize * (long)local_78.h * (long)local_78.w + 0xf &
           0xfffffffffffffff0) / local_78.elemsize;
      local_78.dims = __return_storage_ptr__->dims;
      from_rgb2bgr(pixels,w,h,stride,&local_78,allocator);
      auVar5 = _DAT_005a4940;
      auVar4 = _DAT_005a4930;
      auVar3 = _DAT_005a4070;
      lVar9 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar2 = __return_storage_ptr__->elemsize;
      uVar6 = uVar2 * lVar9 + 0xf & 0xfffffffffffffff0;
      uVar12 = uVar6 % uVar2;
      iVar25 = (int)(uVar6 / uVar2);
      if (__return_storage_ptr__->dims == 4) {
        iVar25 = (int)lVar9;
      }
      uVar13 = iVar25 * __return_storage_ptr__->d;
      if (0 < (int)uVar13) {
        pvVar7 = __return_storage_ptr__->data;
        lVar9 = uVar2 * __return_storage_ptr__->cstep;
        lVar15 = (ulong)uVar13 - 1;
        auVar29._8_4_ = (int)lVar15;
        auVar29._0_8_ = lVar15;
        auVar29._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar12 = 0;
        auVar29 = auVar29 ^ _DAT_005a4070;
        do {
          auVar28._8_4_ = (int)uVar12;
          auVar28._0_8_ = uVar12;
          auVar28._12_4_ = (int)(uVar12 >> 0x20);
          auVar24 = (auVar28 | auVar5) ^ auVar3;
          iVar25 = auVar29._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar25 && auVar29._0_4_ < auVar24._0_4_ ||
                      iVar25 < auVar24._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3) = 0x437f0000;
          }
          if ((auVar24._12_4_ != auVar29._12_4_ || auVar24._8_4_ <= auVar29._8_4_) &&
              auVar24._12_4_ <= auVar29._12_4_) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 4) = 0x437f0000;
          }
          auVar24 = (auVar28 | auVar4) ^ auVar3;
          iVar14 = auVar24._4_4_;
          if (iVar14 <= iVar25 && (iVar14 != iVar25 || auVar24._0_4_ <= auVar29._0_4_)) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar13 + 3 & 0xfffffffc) != uVar12);
      }
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar12);
        return __return_storage_ptr__;
      }
      break;
    case 0x40003:
switchD_00132c3d_caseD_50003:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.w = __return_storage_ptr__->w;
      local_78.h = __return_storage_ptr__->h;
      local_78.d = __return_storage_ptr__->d;
      local_78.elemsize = __return_storage_ptr__->elemsize;
      local_78.elempack = __return_storage_ptr__->elempack;
      local_78.allocator = __return_storage_ptr__->allocator;
      local_78.refcount = (int *)0x0;
      local_78.c = 3;
      local_78.cstep =
           ((long)local_78.d * local_78.elemsize * (long)local_78.h * (long)local_78.w + 0xf &
           0xfffffffffffffff0) / local_78.elemsize;
      local_78.dims = __return_storage_ptr__->dims;
      from_gray2rgb(pixels,w,h,stride,&local_78,allocator);
      auVar5 = _DAT_005a4940;
      auVar4 = _DAT_005a4930;
      auVar3 = _DAT_005a4070;
      lVar9 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar2 = __return_storage_ptr__->elemsize;
      uVar6 = uVar2 * lVar9 + 0xf & 0xfffffffffffffff0;
      uVar12 = uVar6 % uVar2;
      iVar25 = (int)(uVar6 / uVar2);
      if (__return_storage_ptr__->dims == 4) {
        iVar25 = (int)lVar9;
      }
      uVar13 = iVar25 * __return_storage_ptr__->d;
      if (0 < (int)uVar13) {
        pvVar7 = __return_storage_ptr__->data;
        lVar9 = uVar2 * __return_storage_ptr__->cstep;
        lVar15 = (ulong)uVar13 - 1;
        auVar24._8_4_ = (int)lVar15;
        auVar24._0_8_ = lVar15;
        auVar24._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar12 = 0;
        auVar24 = auVar24 ^ _DAT_005a4070;
        do {
          auVar27._8_4_ = (int)uVar12;
          auVar27._0_8_ = uVar12;
          auVar27._12_4_ = (int)(uVar12 >> 0x20);
          auVar29 = (auVar27 | auVar5) ^ auVar3;
          iVar25 = auVar24._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar25 && auVar24._0_4_ < auVar29._0_4_ ||
                      iVar25 < auVar29._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3) = 0x437f0000;
          }
          if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
              auVar29._12_4_ <= auVar24._12_4_) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 4) = 0x437f0000;
          }
          auVar27 = (auVar27 | auVar4) ^ auVar3;
          iVar14 = auVar27._4_4_;
          if (iVar14 <= iVar25 && (iVar14 != iVar25 || auVar27._0_4_ <= auVar24._0_4_)) {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar13 + 3 & 0xfffffffc) != uVar12);
      }
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar12);
        return __return_storage_ptr__;
      }
      break;
    case 0x40004:
      goto switchD_00132c3d_default;
    case 0x40005:
switchD_00132c3d_caseD_50004:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      pvVar7 = __return_storage_ptr__->data;
      if (pvVar7 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar14 = stride + w * -4;
      iVar25 = 1;
      if (iVar14 == 0) {
        iVar25 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pvVar18 = (void *)(lVar9 * 3 + (long)pvVar7);
      pvVar20 = (void *)((long)pvVar7 + lVar9 * 2);
      pvVar11 = (void *)(lVar9 + (long)pvVar7);
      iVar19 = 0;
      do {
        if (0 < iVar25 * w) {
          lVar9 = 0;
          uVar13 = iVar25 * w + 1;
          do {
            *(float *)((long)pvVar7 + lVar9) = (float)pixels[lVar9 + 2];
            *(float *)((long)pvVar11 + lVar9) = (float)pixels[lVar9 + 1];
            *(float *)((long)pvVar20 + lVar9) = (float)pixels[lVar9];
            *(float *)((long)pvVar18 + lVar9) = (float)pixels[lVar9 + 3];
            uVar13 = uVar13 - 1;
            lVar9 = lVar9 + 4;
          } while (1 < uVar13);
          pvVar18 = (void *)((long)pvVar18 + lVar9);
          pvVar20 = (void *)((long)pvVar20 + lVar9);
          pvVar11 = (void *)((long)pvVar11 + lVar9);
          pvVar7 = (void *)((long)pvVar7 + lVar9);
          pixels = pixels + lVar9;
        }
        pixels = pixels + iVar14;
        iVar19 = iVar19 + 1;
      } while (iVar19 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x50001:
        goto switchD_00132c3d_caseD_50001;
      case 0x50002:
        goto switchD_00132c3d_caseD_50002;
      case 0x50003:
        goto switchD_00132c3d_caseD_50003;
      case 0x50004:
        goto switchD_00132c3d_caseD_50004;
      default:
        goto switchD_00132c3d_default;
      }
    }
    if (local_78.data != (void *)0x0) {
      free(local_78.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}